

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O1

bool __thiscall
helics::TimeDependencies::checkIfReadyForExecEntry
          (TimeDependencies *this,bool iterating,bool waiting)

{
  DependencyInfo *pDVar1;
  DependencyInfo *pDVar2;
  pointer pDVar3;
  bool bVar4;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  _Var5;
  pointer pDVar6;
  long lVar7;
  pointer pDVar8;
  undefined7 in_register_00000031;
  DependencyInfo *pDVar9;
  
  if ((int)CONCAT71(in_register_00000031,iterating) != 0) {
    pDVar1 = (this->dependencies).
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pDVar2 = (this->dependencies).
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (waiting) {
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,__gnu_cxx::__ops::_Iter_negate<bool(*)(helics::DependencyInfo_const&)>>
                        (pDVar1,pDVar2,iteratingWaitingDependencyCheck);
    }
    else {
      lVar7 = ((long)pDVar2 - (long)pDVar1 >> 3) * 0x2e8ba2e8ba2e8ba3 >> 2;
      pDVar9 = pDVar1;
      if (0 < lVar7) {
        pDVar9 = pDVar1 + lVar7 * 4;
        lVar7 = lVar7 + 1;
        _Var5._M_current = pDVar1 + 2;
        do {
          if ((_Var5._M_current[-2].dependency == true) &&
             (_Var5._M_current[-2].super_TimeData.mTimeState == initialized)) {
            _Var5._M_current = _Var5._M_current + -2;
            goto LAB_003098a0;
          }
          if ((_Var5._M_current[-1].dependency == true) &&
             (_Var5._M_current[-1].super_TimeData.mTimeState == initialized)) {
            _Var5._M_current = _Var5._M_current + -1;
            goto LAB_003098a0;
          }
          if (((_Var5._M_current)->dependency == true) &&
             (((_Var5._M_current)->super_TimeData).mTimeState == initialized)) goto LAB_003098a0;
          if ((_Var5._M_current[1].dependency == true) &&
             (_Var5._M_current[1].super_TimeData.mTimeState == initialized)) {
            _Var5._M_current = _Var5._M_current + 1;
            goto LAB_003098a0;
          }
          lVar7 = lVar7 + -1;
          _Var5._M_current = _Var5._M_current + 4;
        } while (1 < lVar7);
      }
      lVar7 = ((long)pDVar2 - (long)pDVar9 >> 3) * 0x2e8ba2e8ba2e8ba3;
      if (lVar7 != 1) {
        _Var5._M_current = pDVar9;
        if (lVar7 != 2) {
          _Var5._M_current = pDVar2;
          if ((lVar7 != 3) ||
             ((pDVar9->dependency == true &&
              (_Var5._M_current = pDVar9, (pDVar9->super_TimeData).mTimeState == initialized))))
          goto LAB_003098a0;
          _Var5._M_current = pDVar9 + 1;
        }
        if (((_Var5._M_current)->dependency == true) &&
           (((_Var5._M_current)->super_TimeData).mTimeState == initialized)) goto LAB_003098a0;
        pDVar9 = _Var5._M_current + 1;
      }
      _Var5._M_current = pDVar2;
      if ((pDVar9->super_TimeData).mTimeState == initialized) {
        _Var5._M_current = pDVar9;
      }
      if (pDVar9->dependency == false) {
        _Var5._M_current = pDVar2;
      }
    }
LAB_003098a0:
    return _Var5._M_current == pDVar2;
  }
  if (waiting) {
    bVar4 = checkIfAllDependenciesArePastExec(this,false);
    return bVar4;
  }
  pDVar8 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar3 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar7 = ((long)pDVar3 - (long)pDVar8 >> 3) * 0x2e8ba2e8ba2e8ba3 >> 2;
  pDVar6 = pDVar8;
  if (0 < lVar7) {
    pDVar6 = pDVar8 + lVar7 * 4;
    lVar7 = lVar7 + 1;
    pDVar8 = pDVar8 + 2;
    do {
      if (((pDVar8[-2].dependency == true) &&
          (pDVar8[-2].super_TimeData.mTimeState < exec_requested)) &&
         (pDVar8[-2].connection != SELF)) {
        pDVar8 = pDVar8 + -2;
        goto LAB_00309af3;
      }
      if (((pDVar8[-1].dependency == true) &&
          (pDVar8[-1].super_TimeData.mTimeState < exec_requested)) &&
         (pDVar8[-1].connection != SELF)) {
        pDVar8 = pDVar8 + -1;
        goto LAB_00309af3;
      }
      if (((pDVar8->dependency == true) && ((pDVar8->super_TimeData).mTimeState < exec_requested))
         && (pDVar8->connection != SELF)) goto LAB_00309af3;
      if (((pDVar8[1].dependency == true) && (pDVar8[1].super_TimeData.mTimeState < exec_requested))
         && (pDVar8[1].connection != SELF)) {
        pDVar8 = pDVar8 + 1;
        goto LAB_00309af3;
      }
      lVar7 = lVar7 + -1;
      pDVar8 = pDVar8 + 4;
    } while (1 < lVar7);
  }
  lVar7 = ((long)pDVar3 - (long)pDVar6 >> 3) * 0x2e8ba2e8ba2e8ba3;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pDVar8 = pDVar3;
      if ((lVar7 != 3) ||
         (((pDVar6->dependency == true && ((pDVar6->super_TimeData).mTimeState < exec_requested)) &&
          (pDVar8 = pDVar6, pDVar6->connection != SELF)))) goto LAB_00309af3;
      pDVar6 = pDVar6 + 1;
    }
    if (((pDVar6->dependency == true) && ((pDVar6->super_TimeData).mTimeState < exec_requested)) &&
       (pDVar8 = pDVar6, pDVar6->connection != SELF)) goto LAB_00309af3;
    pDVar6 = pDVar6 + 1;
  }
  pDVar8 = pDVar3;
  if (((pDVar6->dependency == true) && ((pDVar6->super_TimeData).mTimeState < exec_requested)) &&
     (pDVar8 = pDVar6, pDVar6->connection == SELF)) {
    pDVar8 = pDVar3;
  }
LAB_00309af3:
  return pDVar8 == pDVar3;
}

Assistant:

bool TimeDependencies::checkIfReadyForExecEntry(bool iterating, bool waiting) const
{
    if (iterating) {
        if (waiting) {
            return std::all_of(dependencies.begin(),
                               dependencies.end(),
                               iteratingWaitingDependencyCheck);
        }
        return std::none_of(dependencies.begin(), dependencies.end(), [](const auto& dep) {
            return (dep.dependency && dep.mTimeState == TimeState::initialized);
        });
    }
    if (waiting) {
        return checkIfAllDependenciesArePastExec(false);
    }
    return std::none_of(dependencies.begin(), dependencies.end(), [](const auto& dep) {
        return (dep.dependency &&
                (!(dep.mTimeState >= TimeState::exec_requested ||
                   (dep.connection == ConnectionType::SELF &&
                    dep.mTimeState >= TimeState::initialized))));
    });
}